

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packer.cpp
# Opt level: O0

void __thiscall CPacker::AddRaw(CPacker *this,void *pData,int Size)

{
  uchar uVar1;
  uchar *puVar2;
  uchar *pSrc;
  int Size_local;
  void *pData_local;
  CPacker *this_local;
  
  if (this->m_Error == 0) {
    pSrc = (uchar *)pData;
    Size_local = Size;
    if (this->m_pCurrent + Size < this->m_pEnd) {
      for (; Size_local != 0; Size_local = Size_local + -1) {
        uVar1 = *pSrc;
        puVar2 = this->m_pCurrent;
        this->m_pCurrent = puVar2 + 1;
        *puVar2 = uVar1;
        pSrc = pSrc + 1;
      }
    }
    else {
      this->m_Error = 1;
    }
  }
  return;
}

Assistant:

void CPacker::AddRaw(const void *pData, int Size)
{
	if(m_Error)
		return;

	if(m_pCurrent+Size >= m_pEnd)
	{
		m_Error = 1;
		return;
	}

	const unsigned char *pSrc = (const unsigned char *)pData;
	while(Size)
	{
		*m_pCurrent++ = *pSrc++;
		Size--;
	}
}